

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

bool __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::handleFork
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *this,PSNode *forkNode,
          PSNode *called)

{
  dg::pta::LLVMPointerGraphBuilder::addFunctionToFork((PSNode *)this->builder,(PSNodeFork *)called);
  return true;
}

Assistant:

bool handleFork(PSNode *forkNode, PSNode *called) override {
        using namespace llvm;
        using namespace dg::pta;

        assert(called->getType() == PSNodeType::FUNCTION &&
               "The called value is not a function");

        PSNodeFork *fork = PSNodeFork::get(forkNode);
        builder->addFunctionToFork(called, fork);

#ifndef NDEBUG
        // check the graph after rebuilding, but do not check for connectivity,
        // because we can call a function that will disconnect the graph
        if (!builder->validateSubgraph(true)) {
            const llvm::Function *F = llvm::cast<llvm::Function>(
                    called->getUserData<llvm::Value>());
            llvm::errs() << "Pointer Subgraph is broken!\n";
            llvm::errs() << "This happend after building this function spawned "
                            "in a thread: "
                         << F->getName() << "\n";
            abort();
        }
#endif // NDEBUG

        return true;
    }